

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_static.c
# Opt level: O1

char * zip_name_normalize(char *name,char *nname,size_t len)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  if (len == 0 || (nname == (char *)0x0 || name == (char *)0x0)) {
    return (char *)0x0;
  }
  for (; (*name == '/' || (*name == '\\')); name = name + 1) {
  }
  lVar4 = 0;
  do {
    pcVar3 = nname + lVar4;
    lVar6 = 0;
    do {
      do {
        while( true ) {
          lVar5 = lVar6;
          cVar2 = *name;
          name = name + 1;
          if ((cVar2 == '/') || (cVar2 == '\\')) break;
          if (cVar2 == '\0') {
            if (lVar5 == 0) goto LAB_00101718;
            lVar4 = 0;
            goto LAB_00101705;
          }
          pcVar3[lVar5] = cVar2;
          lVar6 = lVar5 + 1;
        }
        lVar6 = 0;
      } while (lVar5 == 0);
      lVar6 = 0;
      do {
        pcVar1 = pcVar3 + lVar6;
        if (*pcVar1 != '.') break;
        bVar7 = lVar5 + -1 != lVar6;
        lVar6 = lVar6 + 1;
      } while (bVar7);
      lVar6 = 0;
    } while (*pcVar1 == '.');
    lVar6 = lVar5 + lVar4;
    lVar4 = lVar4 + lVar5 + 1;
    nname[lVar6] = cVar2;
  } while( true );
  while (lVar4 = lVar4 + 1, lVar5 != lVar4) {
LAB_00101705:
    if (pcVar3[lVar4] != '.') {
      pcVar3 = pcVar3 + lVar5;
      break;
    }
  }
LAB_00101718:
  *pcVar3 = '\0';
  return nname;
}

Assistant:

static char *zip_name_normalize(char *name, char *const nname, size_t len) {
  size_t offn = 0, ncpy = 0;
  char c;

  if (name == NULL || nname == NULL || len <= 0) {
    return NULL;
  }
  // skip trailing '/'
  while (ISSLASH(*name)) {
    name++;
  }

  while ((c = *name++)) {
    if (ISSLASH(c)) {
      if (ncpy > 0 && !zip_strchr_match(&nname[offn], ncpy, '.')) {
        offn += ncpy;
        nname[offn++] = c; // append '/'
      }
      ncpy = 0;
    } else {
      nname[offn + ncpy] = c;
      if (c) {
        ncpy++;
      }
    }
  }

  if (!zip_strchr_match(&nname[offn], ncpy, '.')) {
    nname[offn + ncpy] = '\0';
  } else {
    nname[offn] = '\0';
  }

  return nname;
}